

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBasicTypeArray<std::array<int,4ul>>
          (AsciiParser *this,
          vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *result)

{
  pointer paVar1;
  bool bVar2;
  bool bVar3;
  undefined8 in_RAX;
  char c;
  char local_11;
  
  local_11 = (char)((ulong)in_RAX >> 0x38);
  bVar3 = Expect(this,'[');
  if (!bVar3) {
    return false;
  }
  bVar3 = SkipCommentAndWhitespaceAndNewline(this,true);
  if (!bVar3) {
    return false;
  }
  bVar3 = Char1(this,&local_11);
  if (bVar3) {
    if (local_11 != ']') {
      bVar3 = Rewind(this,1);
      bVar2 = true;
      goto LAB_003cba0d;
    }
    paVar1 = (result->
             super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    bVar3 = true;
    if ((result->super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
        _M_impl.super__Vector_impl_data._M_finish != paVar1) {
      (result->super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
      _M_impl.super__Vector_impl_data._M_finish = paVar1;
    }
  }
  else {
    bVar3 = false;
  }
  bVar2 = false;
LAB_003cba0d:
  if (!bVar2) {
    return bVar3;
  }
  bVar3 = SepBy1BasicType<std::array<int,4ul>>(this,',',']',result);
  if ((bVar3) && (bVar3 = SkipCommentAndWhitespaceAndNewline(this,true), bVar3)) {
    bVar3 = Expect(this,']');
    return bVar3;
  }
  return false;
}

Assistant:

bool AsciiParser::ParseBasicTypeArray(std::vector<T> *result) {
  if (!Expect('[')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  // Empty array?
  {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == ']') {
      result->clear();
      return true;
    }

    Rewind(1);
  }

  if (!SepBy1BasicType<T>(',', ']', result)) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  if (!Expect(']')) {
    return false;
  }
  return true;
}